

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

void xmlBufferWriteQuotedString(xmlBufferPtr buf,xmlChar *string)

{
  xmlChar *pxVar1;
  xmlChar *local_28;
  xmlChar *base;
  xmlChar *cur;
  xmlChar *string_local;
  xmlBufferPtr buf_local;
  
  if ((buf != (xmlBufferPtr)0x0) && (buf->alloc != XML_BUFFER_ALLOC_IMMUTABLE)) {
    pxVar1 = xmlStrchr(string,'\"');
    if (pxVar1 == (xmlChar *)0x0) {
      xmlBufferCCat(buf,"\"");
      xmlBufferCat(buf,string);
      xmlBufferCCat(buf,"\"");
    }
    else {
      pxVar1 = xmlStrchr(string,'\'');
      if (pxVar1 == (xmlChar *)0x0) {
        xmlBufferCCat(buf,"\'");
        xmlBufferCat(buf,string);
        xmlBufferCCat(buf,"\'");
      }
      else {
        xmlBufferCCat(buf,"\"");
        local_28 = string;
        base = string;
        while( true ) {
          if (*base == '\0') break;
          if (*base == '\"') {
            if (local_28 != base) {
              xmlBufferAdd(buf,local_28,(int)base - (int)local_28);
            }
            xmlBufferAdd(buf,(xmlChar *)"&quot;",6);
            local_28 = base + 1;
          }
          base = base + 1;
        }
        if (local_28 != base) {
          xmlBufferAdd(buf,local_28,(int)base - (int)local_28);
        }
        xmlBufferCCat(buf,"\"");
      }
    }
  }
  return;
}

Assistant:

void
xmlBufferWriteQuotedString(xmlBufferPtr buf, const xmlChar *string) {
    const xmlChar *cur, *base;
    if (buf == NULL)
        return;
    if (buf->alloc == XML_BUFFER_ALLOC_IMMUTABLE) return;
    if (xmlStrchr(string, '\"')) {
        if (xmlStrchr(string, '\'')) {
#ifdef DEBUG_BUFFER
	    xmlGenericError(xmlGenericErrorContext,
 "xmlBufferWriteQuotedString: string contains quote and double-quotes !\n");
#endif
	    xmlBufferCCat(buf, "\"");
            base = cur = string;
            while(*cur != 0){
                if(*cur == '"'){
                    if (base != cur)
                        xmlBufferAdd(buf, base, cur - base);
                    xmlBufferAdd(buf, BAD_CAST "&quot;", 6);
                    cur++;
                    base = cur;
                }
                else {
                    cur++;
                }
            }
            if (base != cur)
                xmlBufferAdd(buf, base, cur - base);
	    xmlBufferCCat(buf, "\"");
	}
        else{
	    xmlBufferCCat(buf, "\'");
            xmlBufferCat(buf, string);
	    xmlBufferCCat(buf, "\'");
        }
    } else {
        xmlBufferCCat(buf, "\"");
        xmlBufferCat(buf, string);
        xmlBufferCCat(buf, "\"");
    }
}